

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

QRect __thiscall QtMWidgets::SliderPrivate::handleRect(SliderPrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  QRect QVar10;
  
  auVar9 = QWidget::contentsRect();
  iVar2 = QAbstractSlider::orientation();
  uVar8 = auVar9._0_4_;
  uVar7 = auVar9._4_4_;
  if (iVar2 == 2) {
    iVar6 = ((int)((auVar9._8_4_ - uVar8) + 1) / 2 + uVar8) - this->radius;
    iVar3 = QAbstractSlider::minimum();
    iVar4 = QAbstractSlider::maximum();
    iVar5 = QAbstractSlider::sliderPosition();
    iVar2 = this->radius;
    bVar1 = (bool)QAbstractSlider::invertedAppearance();
    iVar3 = QStyle::sliderPositionFromValue
                      (iVar3,iVar4,iVar5,~uVar7 + auVar9._12_4_ + iVar2 * -2,bVar1);
    iVar2 = this->radius;
  }
  else {
    iVar6 = QAbstractSlider::minimum();
    iVar3 = QAbstractSlider::maximum();
    iVar4 = QAbstractSlider::sliderPosition();
    iVar2 = this->radius;
    bVar1 = (bool)QAbstractSlider::invertedAppearance();
    iVar6 = QStyle::sliderPositionFromValue
                      (iVar6,iVar3,iVar4,~uVar8 + auVar9._8_4_ + iVar2 * -2,bVar1);
    iVar2 = this->radius;
    iVar3 = ((int)((auVar9._12_4_ - uVar7) + 1) / 2 + uVar7) - iVar2;
  }
  QVar10.x2 = iVar6 + iVar2 * 2;
  QVar10.y1 = iVar3 + 1;
  QVar10.x1 = iVar6 + 1;
  QVar10.y2 = iVar3 + iVar2 * 2;
  return QVar10;
}

Assistant:

QRect
SliderPrivate::handleRect() const
{
	const QRect cr = q->contentsRect();

	int hx = 0, hy = 0;

	if( q->orientation() == Qt::Vertical )
	{
		hx = cr.topLeft().x() + cr.width() / 2 - radius + 1;
		hy = QStyle::sliderPositionFromValue( q->minimum(), q->maximum(),
			q->sliderPosition(), cr.height() - radius * 2 - 2,
			q->invertedAppearance() ) + 1;
	}
	else
	{
		hx = QStyle::sliderPositionFromValue( q->minimum(), q->maximum(),
			q->sliderPosition(), cr.width() - radius * 2 - 2,
			q->invertedAppearance() ) + 1;
		hy = cr.topLeft().y() + cr.height() / 2 - radius + 1;
	}

	return QRect( hx, hy, radius * 2, radius * 2 );
}